

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_select.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListSelectBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalType *other;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  element_type *peVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  bool bVar7;
  reference pvVar8;
  pointer pEVar9;
  reference pvVar10;
  undefined8 *puVar11;
  pointer *__ptr;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  LogicalType child_type;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  undefined8 local_80;
  _Alloc_hider _Stack_78;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  LogicalType local_58;
  LogicalType local_40;
  
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  local_70._M_head_impl =
       (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)&local_88,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_70);
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  _Var3._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (Expression *)0x0;
  _Var1._M_head_impl =
       (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_88._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_88._M_head_impl + 8))();
  }
  local_88._M_head_impl = (Expression *)0x0;
  if (local_70._M_head_impl != (Expression *)0x0) {
    (*((local_70._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_70._M_head_impl = (Expression *)0x0;
  LogicalType::LogicalType(&local_40);
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar8);
  LogicalType::LogicalType((LogicalType *)&local_88,UNKNOWN);
  bVar6 = LogicalType::operator==(&pEVar9->return_type,(LogicalType *)&local_88);
  bVar7 = true;
  if (!bVar6) {
    pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar8);
    LogicalType::LogicalType(&local_58,UNKNOWN);
    bVar7 = LogicalType::operator==(&pEVar9->return_type,&local_58);
    LogicalType::~LogicalType(&local_58);
  }
  LogicalType::~LogicalType((LogicalType *)&local_88);
  if (bVar7 == false) {
    pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar8);
    other = &(bound_function->super_BaseScalarFunction).return_type;
    if (other != &pEVar9->return_type) {
      (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar9->return_type).id_;
      (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
           (pEVar9->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                 &(pEVar9->return_type).type_info_);
    }
    puVar11 = (undefined8 *)operator_new(0x20);
    LogicalType::LogicalType((LogicalType *)&local_88,other);
  }
  else {
    LogicalType::LogicalType((LogicalType *)&local_88,UNKNOWN);
    pvVar10 = vector<duckdb::LogicalType,_true>::operator[]
                        (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,
                         0);
    _Var5._M_p = _Stack_78._M_p;
    peVar4 = local_80;
    pvVar10->id_ = (LogicalTypeId)local_88._M_head_impl;
    pvVar10->physical_type_ = local_88._M_head_impl._1_1_;
    uVar12 = *(undefined4 *)
              &(pvVar10->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar13 = *(undefined4 *)
              ((long)&(pvVar10->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar14 = *(undefined4 *)
              &(pvVar10->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar15 = *(undefined4 *)
              ((long)&(pvVar10->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_80 = (element_type *)0x0;
    _Stack_78._M_p = (pointer)0x0;
    p_Var2 = (pvVar10->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    (pvVar10->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_68._M_allocated_capacity._0_4_ = uVar12;
      local_68._M_allocated_capacity._4_4_ = uVar13;
      local_68._8_4_ = uVar14;
      local_68._12_4_ = uVar15;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      uVar12 = local_68._M_allocated_capacity._0_4_;
      uVar13 = local_68._M_allocated_capacity._4_4_;
      uVar14 = local_68._8_4_;
      uVar15 = local_68._12_4_;
    }
    _Var5._M_p = _Stack_78._M_p;
    local_80 = (element_type *)CONCAT44(uVar13,uVar12);
    _Stack_78._M_p._4_4_ = uVar15;
    _Stack_78._M_p._0_4_ = uVar14;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p);
    }
    LogicalType::~LogicalType((LogicalType *)&local_88);
    LogicalType::LogicalType((LogicalType *)&local_88,SQLNULL);
    _Var5._M_p = _Stack_78._M_p;
    peVar4 = local_80;
    (bound_function->super_BaseScalarFunction).return_type.id_ =
         (LogicalTypeId)local_88._M_head_impl;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
         local_88._M_head_impl._1_1_;
    uVar12 = *(undefined4 *)
              &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar13 = *(undefined4 *)
              ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar14 = *(undefined4 *)
              &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar15 = *(undefined4 *)
              ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_80 = (element_type *)0x0;
    _Stack_78._M_p = (pointer)0x0;
    p_Var2 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_68._M_allocated_capacity._0_4_ = uVar12;
      local_68._M_allocated_capacity._4_4_ = uVar13;
      local_68._8_4_ = uVar14;
      local_68._12_4_ = uVar15;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      uVar12 = local_68._M_allocated_capacity._0_4_;
      uVar13 = local_68._M_allocated_capacity._4_4_;
      uVar14 = local_68._8_4_;
      uVar15 = local_68._12_4_;
    }
    _Var5._M_p = _Stack_78._M_p;
    local_80 = (element_type *)CONCAT44(uVar13,uVar12);
    _Stack_78._M_p._4_4_ = uVar15;
    _Stack_78._M_p._0_4_ = uVar14;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p);
    }
    LogicalType::~LogicalType((LogicalType *)&local_88);
    puVar11 = (undefined8 *)operator_new(0x20);
    LogicalType::LogicalType
              ((LogicalType *)&local_88,&(bound_function->super_BaseScalarFunction).return_type);
  }
  *puVar11 = &PTR__VariableReturnBindData_0247f968;
  LogicalType::LogicalType((LogicalType *)(puVar11 + 1),(LogicalType *)&local_88);
  LogicalType::~LogicalType((LogicalType *)&local_88);
  *(undefined8 **)this = puVar11;
  LogicalType::~LogicalType(&local_40);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListSelectBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2);

	// If the first argument is an array, cast it to a list
	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	LogicalType child_type;
	if (arguments[0]->return_type == LogicalTypeId::UNKNOWN || arguments[1]->return_type == LogicalTypeId::UNKNOWN) {
		bound_function.arguments[0] = LogicalTypeId::UNKNOWN;
		bound_function.return_type = LogicalType::SQLNULL;
		return make_uniq<VariableReturnBindData>(bound_function.return_type);
	}

	D_ASSERT(LogicalTypeId::LIST == arguments[0]->return_type.id() ||
	         LogicalTypeId::SQLNULL == arguments[0]->return_type.id());

	bound_function.return_type = arguments[0]->return_type;
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}